

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O0

int pt_qry_start(pt_query_decoder *decoder,uint64_t *ip)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint local_7a4;
  int status;
  int flags;
  int errcode;
  pt_event ev;
  pt_event_decoder evdec;
  uint64_t *ip_local;
  pt_query_decoder *decoder_local;
  
  if (decoder == (pt_query_decoder *)0x0) {
    decoder_local._4_4_ = 0xfffffffe;
  }
  else {
    memcpy((void *)((long)&ev.variant + 0x18),decoder,0x730);
    local_7a4 = 2;
    do {
      puVar2 = pt_evt_pos((pt_event_decoder *)((long)&ev.variant + 0x18));
      puVar3 = pt_qry_pos(decoder);
      if (puVar2 != puVar3) goto LAB_0010ccc2;
      iVar1 = pt_evt_next((pt_event_decoder *)((long)&ev.variant + 0x18),(pt_event *)&flags,0x48);
      if (iVar1 < 0) {
        if (iVar1 != -7) {
          return iVar1;
        }
        goto LAB_0010ccc2;
      }
      if (((byte)errcode >> 1 & 1) == 0) goto LAB_0010ccc2;
    } while (flags != 0);
    local_7a4 = 0;
    if (ip != (uint64_t *)0x0) {
      *ip = ev.reserved[1];
    }
LAB_0010ccc2:
    decoder->status = 0;
    decoder_local._4_4_ = pt_qry_fetch_event(decoder);
    if ((-1 < (int)decoder_local._4_4_) &&
       (decoder_local._4_4_ = pt_qry_status_flags(decoder), -1 < (int)decoder_local._4_4_)) {
      decoder_local._4_4_ = decoder_local._4_4_ | local_7a4;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_qry_start(struct pt_query_decoder *decoder, uint64_t *ip)
{
	struct pt_event_decoder evdec;
	struct pt_event ev;
	int errcode, flags, status;

	if (!decoder)
		return -pte_invalid;

	/* We need to process satus update events from PSB+ in order to
	 * provide the start IP.
	 *
	 * On the other hand, we need to provide those same status events to
	 * our user.  We do that by using a local copy of our event decoder, so
	 * when we're done, we rewind back to where we started.
	 */
	evdec = decoder->evdec;

	status = pts_ip_suppressed;

	/* Process status update events from PSB+ to initialize our state. */
	for (;;) {
		/* Check that we're still processing the initial events.
		 *
		 * When the event decoder moves ahead, we're done with the
		 * initial PSB+.  We may get additional events from an adjacent
		 * PSB+, but we don't want to process them here.
		 */
		if (pt_evt_pos(&evdec) != pt_qry_pos(decoder))
			break;

		errcode = pt_evt_next(&evdec, &ev, sizeof(ev));
		if (errcode < 0) {
			if (errcode != -pte_eos)
				return errcode;

			break;
		}

		if (!ev.status_update)
			break;

		switch (ev.type) {
		case ptev_enabled:
			status &= ~pts_ip_suppressed;
			if (ip)
				*ip = ev.variant.enabled.ip;

			break;

		default:
			continue;
		}

		break;
	}

	decoder->status = 0;

	errcode = pt_qry_fetch_event(decoder);
	if (errcode < 0)
		return errcode;

	flags = pt_qry_status_flags(decoder);
	if (flags < 0)
		return flags;

	status |= flags;

	return status;
}